

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O1

int ply_read_header_comment(p_ply ply)

{
  int iVar1;
  
  iVar1 = strcmp(ply->buffer + ply->buffer_token,"comment");
  if (iVar1 == 0) {
    iVar1 = ply_read_line(ply);
    if (iVar1 != 0) {
      iVar1 = ply_add_comment(ply,ply->buffer + ply->buffer_token);
      if (iVar1 != 0) {
        iVar1 = ply_read_word(ply);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int ply_read_header_comment(p_ply ply) {
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "comment")) return 0;
    if (!ply_read_line(ply)) return 0;
    if (!ply_add_comment(ply, BLINE(ply))) return 0;
    if (!ply_read_word(ply)) return 0;
    return 1;
}